

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile.cpp
# Opt level: O3

void __thiscall WriteFile::WriteUnbuffered(WriteFile *this,char *data,size_t writeSize)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  
  bVar3 = writeSize == 0;
  do {
    if (bVar3) {
      return;
    }
    while (sVar1 = write(this->m_fd,data,writeSize), sVar1 < 0) {
      piVar2 = __errno_location();
      if (!(bool)(*piVar2 == 4 & (bVar3 ^ 1U))) {
        return;
      }
    }
    data = data + sVar1;
    writeSize = writeSize - sVar1;
    bVar3 = writeSize == 0;
  } while( true );
}

Assistant:

void WriteFile::WriteUnbuffered(const char * data, size_t writeSize)
{
	while(0 < writeSize)
	{
		ssize_t nWriten = write(m_fd, data, writeSize);
		if (0 > nWriten)
		{
			// retry
			if (EINTR == errno)
			{
				continue;
			}
			return;
		}
		
		writeSize -= nWriten;
		data += nWriten;
	}
}